

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenStringIterMoveSetRef(BinaryenExpressionRef expr,BinaryenExpressionRef refExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef refExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::StringIterMove>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<StringIterMove>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x12db,
                  "void BinaryenStringIterMoveSetRef(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (refExpr != (BinaryenExpressionRef)0x0) {
    expr[1].type.id = (uintptr_t)refExpr;
    return;
  }
  __assert_fail("refExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x12dc,
                "void BinaryenStringIterMoveSetRef(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringIterMoveSetRef(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef refExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringIterMove>());
  assert(refExpr);
  static_cast<StringIterMove*>(expression)->ref = (Expression*)refExpr;
}